

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionAddStr.cpp
# Opt level: O2

void __thiscall Hpipe::InstructionAddStr::get_code_repr(InstructionAddStr *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"ADD_STR ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,(string *)&this->var);
  return;
}

Assistant:

void InstructionAddStr::get_code_repr( std::ostream &os ) {
    os << "ADD_STR " << var.size() << " " << var;
}